

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O2

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMeshNormals(CXMeshFileLoader *this,SXMesh *mesh)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer pSVar5;
  pointer puVar6;
  pointer pSVar7;
  float fVar8;
  bool bVar9;
  bool bVar10;
  u32 uVar11;
  u32 uVar12;
  u32 uVar13;
  char *this_00;
  int iVar14;
  long lVar15;
  ulong uVar16;
  u32 h;
  ulong uVar17;
  uint uVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db_07;
  array<irr::core::vector3d<float>_> normals;
  array<unsigned_int> polygonfaces;
  array<unsigned_int> normalIndices;
  string<char> local_50;
  
  bVar9 = readHeadOfDataObject(this,(stringc *)0x0);
  if (bVar9) {
    uVar11 = readInt(this);
    normals.m_data.
    super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    normals.m_data.
    super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    normals.m_data.
    super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    normals.is_sorted = true;
    ::std::vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::resize
              (&normals.m_data,(ulong)uVar11);
    for (lVar15 = 0; (ulong)uVar11 * 0xc - lVar15 != 0; lVar15 = lVar15 + 0xc) {
      readVector3(this,(vector3df *)
                       ((long)&(normals.m_data.
                                super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->X + lVar15));
    }
    bVar9 = checkForTwoFollowingSemicolons(this);
    if (!bVar9) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Normals Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      core::string<char>::string((string<char> *)&normalIndices,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      ::std::__cxx11::string::_M_dispose();
    }
    normalIndices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    normalIndices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    normalIndices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    normalIndices.is_sorted = true;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&normalIndices.m_data,
               (ulong)((long)(mesh->Indices).m_data.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(mesh->Indices).m_data.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
    uVar11 = readInt(this);
    polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    polygonfaces.is_sorted = true;
    uVar18 = 0;
    for (uVar16 = 0; (u32)uVar16 != uVar11; uVar16 = (ulong)((u32)uVar16 + 1)) {
      uVar12 = readInt(this);
      uVar1 = uVar12 - 2;
      if (uVar1 * 3 !=
          (uint)(mesh->IndexCountPerFace).m_data.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16]) {
        this_00 = "Not matching normal and face index count found in x file";
        uVar19 = extraout_XMM0_Da_03;
        uVar20 = extraout_XMM0_Db_03;
        goto LAB_001de9c3;
      }
      if (uVar1 == 1) {
        for (iVar14 = 0; uVar2 = uVar18 + 3, iVar14 != 3; iVar14 = iVar14 + 1) {
          uVar12 = readInt(this);
          pSVar5 = (mesh->Vertices).m_data.
                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar1 = (mesh->Indices).m_data.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar18 + iVar14];
          fVar8 = normals.m_data.
                  super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].Y;
          pSVar7 = pSVar5 + uVar1;
          (pSVar7->Normal).X =
               normals.m_data.
               super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].X;
          (pSVar7->Normal).Y = fVar8;
          pSVar5[uVar1].Normal.Z =
               normals.m_data.
               super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].Z;
        }
      }
      else {
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&polygonfaces.m_data,(ulong)uVar12);
        for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
          uVar13 = readInt(this);
          polygonfaces.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar17] = uVar13;
        }
        pSVar5 = (mesh->Vertices).m_data.
                 super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar6 = (mesh->Indices).m_data.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar17 = 2; uVar2 = uVar18, uVar17 - uVar1 != 2; uVar17 = uVar17 + 1) {
          uVar2 = puVar6[uVar18];
          uVar3 = *polygonfaces.m_data.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar8 = normals.m_data.
                  super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].Y;
          pSVar5[uVar2].Normal.X =
               normals.m_data.
               super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3].X;
          pSVar5[uVar2].Normal.Y = fVar8;
          pSVar5[uVar2].Normal.Z =
               normals.m_data.
               super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3].Z;
          uVar2 = uVar18 + 2;
          uVar3 = puVar6[uVar18 + 1];
          uVar4 = polygonfaces.m_data.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17 - 1];
          fVar8 = normals.m_data.
                  super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar4].Y;
          pSVar5[uVar3].Normal.X =
               normals.m_data.
               super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4].X;
          pSVar5[uVar3].Normal.Y = fVar8;
          pSVar5[uVar3].Normal.Z =
               normals.m_data.
               super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4].Z;
          uVar18 = uVar18 + 3;
          uVar2 = puVar6[uVar2];
          uVar3 = polygonfaces.m_data.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17 & 0xffffffff];
          fVar8 = normals.m_data.
                  super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].Y;
          pSVar5[uVar2].Normal.X =
               normals.m_data.
               super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3].X;
          pSVar5[uVar2].Normal.Y = fVar8;
          pSVar5[uVar2].Normal.Z =
               normals.m_data.
               super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3].Z;
        }
      }
      uVar18 = uVar2;
    }
    bVar9 = checkForTwoFollowingSemicolons(this);
    if (!bVar9) {
      os::Printer::log((Printer *)
                       "No finishing semicolon in Mesh Face Normals Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      core::string<char>::string(&local_50,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      ::std::__cxx11::string::_M_dispose();
    }
    bVar10 = checkForClosingBrace(this);
    bVar9 = true;
    if (!bVar10) {
      this_00 = "No closing brace in Mesh Normals found in x file";
      uVar19 = extraout_XMM0_Da_06;
      uVar20 = extraout_XMM0_Db_06;
LAB_001de9c3:
      os::Printer::log((Printer *)this_00,(double)CONCAT44(uVar20,uVar19));
      core::string<char>::string(&local_50,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      ::std::__cxx11::string::_M_dispose();
      this->ErrorState = true;
      bVar9 = false;
    }
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&polygonfaces);
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&normalIndices);
    ::std::_Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::
    ~_Vector_base((_Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                   *)&normals);
  }
  else {
    os::Printer::log((Printer *)"No opening brace in Mesh Normals found in x file",
                     (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    core::string<char>::string((string<char> *)&normals,this->Line);
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    ::std::__cxx11::string::_M_dispose();
    this->ErrorState = true;
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMeshNormals(SXMesh &mesh)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading mesh normals", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Mesh Normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read count
	const u32 nNormals = readInt();
	core::array<core::vector3df> normals;
	normals.set_used(nNormals);

	// read normals
	for (u32 i = 0; i < nNormals; ++i)
		readVector3(normals[i]);

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Normals Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	core::array<u32> normalIndices;
	normalIndices.set_used(mesh.Indices.size());

	// read face normal indices
	const u32 nFNormals = readInt();
	// if (nFNormals >= mesh.IndexCountPerFace.size())
	if (0) { // this condition doesn't work for some reason
		os::Printer::log("Too many face normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	u32 normalidx = 0;
	core::array<u32> polygonfaces;
	for (u32 k = 0; k < nFNormals; ++k) {
		const u32 fcnt = readInt();
		u32 triangles = fcnt - 2;
		u32 indexcount = triangles * 3;

		if (indexcount != mesh.IndexCountPerFace[k]) {
			os::Printer::log("Not matching normal and face index count found in x file", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		}

		if (indexcount == 3) {
			// default, only one triangle in this face
			for (u32 h = 0; h < 3; ++h) {
				const u32 normalnum = readInt();
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[normalnum]);
			}
		} else {
			polygonfaces.set_used(fcnt);
			// multiple triangles in this face
			for (u32 h = 0; h < fcnt; ++h)
				polygonfaces[h] = readInt();

			for (u32 jk = 0; jk < triangles; ++jk) {
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[0]]);
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[jk + 1]]);
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[jk + 2]]);
			}
		}
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Face Normals Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in Mesh Normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	return true;
}